

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concur19.cc
# Opt level: O2

void __thiscall
tchecker::tck_reach::concur19::node_le_t::node_le_t
          (node_le_t *this,shared_ptr<tchecker::clockbounds::clockbounds_t> *clockbounds)

{
  clock_id_t cVar1;
  map_t *pmVar2;
  
  std::__shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2> *)this,
             &clockbounds->
              super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>);
  cVar1 = tchecker::clockbounds::clockbounds_t::clocks_number
                    ((this->_clockbounds).
                     super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  pmVar2 = tchecker::clockbounds::allocate_map((ulong)cVar1);
  this->_l = pmVar2;
  cVar1 = tchecker::clockbounds::clockbounds_t::clocks_number
                    ((this->_clockbounds).
                     super___shared_ptr<tchecker::clockbounds::clockbounds_t,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  pmVar2 = tchecker::clockbounds::allocate_map((ulong)cVar1);
  this->_u = pmVar2;
  return;
}

Assistant:

node_le_t::node_le_t(std::shared_ptr<tchecker::clockbounds::clockbounds_t> const & clockbounds) : _clockbounds(clockbounds)
{
  _l = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
  _u = tchecker::clockbounds::allocate_map(_clockbounds->clocks_number());
}